

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_1::CheckRequiredCapabilities
          (ValidationState_t *state,Instruction *inst,size_t which_operand,
          spv_parsed_operand_t *operand,uint32_t word)

{
  AssemblyGrammar *this;
  char cVar1;
  spv_operand_type_t sVar2;
  uint uVar3;
  uint uVar4;
  spv_operand_desc val;
  bool bVar5;
  spv_result_t sVar6;
  char *pcVar7;
  DiagnosticStream *pDVar8;
  Instruction *grammar;
  size_t cardinal;
  size_t cardinal_00;
  size_t cardinal_01;
  ExtensionSet *extensions;
  spv_result_t sVar9;
  spv_operand_desc operand_desc;
  CapabilitySet enabling_capabilities;
  ExtensionSet required_extensions;
  string local_248;
  string local_228;
  DiagnosticStream local_208;
  
  sVar2 = operand->type;
  if (sVar2 == SPV_OPERAND_TYPE_FP_ROUNDING_MODE) {
    cVar1 = (state->features_).free_fp_rounding_mode;
joined_r0x001ba6ae:
    if (cVar1 != '\0') {
      return SPV_SUCCESS;
    }
  }
  else if (sVar2 == SPV_OPERAND_TYPE_GROUP_OPERATION) {
    if (word < 3) {
      cVar1 = (state->features_).group_ops_reduce_and_scans;
      goto joined_r0x001ba6ae;
    }
  }
  else if (((sVar2 == SPV_OPERAND_TYPE_BUILT_IN) && (word < 5)) &&
          ((0x1aU >> (word & 0x1f) & 1) != 0)) {
    return SPV_SUCCESS;
  }
  EnumSet<spv::Capability>::EnumSet(&enabling_capabilities);
  operand_desc = (spv_operand_desc)0x0;
  this = &state->grammar_;
  sVar6 = AssemblyGrammar::lookupOperand(this,operand->type,word,&operand_desc);
  sVar9 = SPV_SUCCESS;
  if (sVar6 == SPV_SUCCESS) {
    sVar9 = SPV_SUCCESS;
    if ((operand->type == SPV_OPERAND_TYPE_DECORATION) && (operand_desc->value == 0x27)) {
      if ((state->features_).free_fp_rounding_mode != false) goto LAB_001baaec;
      bVar5 = spvIsVulkanEnv(state->context_->target_env);
      if (bVar5) {
        required_extensions.buckets_.
        super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1151;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&local_208,
                   &enabling_capabilities,(Capability *)&required_extensions);
        required_extensions.buckets_.
        super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1152;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&local_208,
                   &enabling_capabilities,(Capability *)&required_extensions);
        required_extensions.buckets_.
        super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1153;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&local_208,
                   &enabling_capabilities,(Capability *)&required_extensions);
        required_extensions.buckets_.
        super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x1154;
        EnumSet<spv::Capability>::insert
                  ((pair<spvtools::EnumSet<spv::Capability>::Iterator,_bool> *)&local_208,
                   &enabling_capabilities,(Capability *)&required_extensions);
      }
    }
    else {
      AssemblyGrammar::filterCapsAgainstTargetEnv
                ((CapabilitySet *)&local_208,this,operand_desc->capabilities,
                 operand_desc->numCapabilities);
      EnumSet<spv::Capability>::operator=
                (&enabling_capabilities,(EnumSet<spv::Capability> *)&local_208);
      std::
      _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
      ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                       *)&local_208);
    }
    if ((((inst->inst_).opcode == 0x11) ||
        (bVar5 = ValidationState_t::HasAnyOfCapabilities(state,&enabling_capabilities), bVar5)) ||
       (enabling_capabilities.size_ == 0)) {
      val = operand_desc;
      uVar3 = state->version_;
      uVar4 = operand_desc->minVersion;
      if ((uVar3 <= operand_desc->lastVersion && uVar4 <= uVar3) && uVar4 != 0xffffffff)
      goto LAB_001baaec;
      if (operand_desc->lastVersion < uVar3) {
        ValidationState_t::diag(&local_208,state,SPV_ERROR_WRONG_VERSION,inst);
        utils::CardinalToOrdinal_abi_cxx11_
                  ((string *)&required_extensions,(utils *)which_operand,cardinal);
        std::operator<<((ostream *)&local_208,(string *)&required_extensions);
        std::operator<<((ostream *)&local_208," operand of ");
        pcVar7 = spvOpcodeString((uint)(inst->inst_).opcode);
        std::operator<<((ostream *)&local_208,pcVar7);
        std::operator<<((ostream *)&local_208,": operand ");
        pDVar8 = DiagnosticStream::operator<<(&local_208,&val->name);
        std::operator<<((ostream *)pDVar8,"(");
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
        std::operator<<((ostream *)pDVar8,") requires SPIR-V version ");
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
        std::operator<<((ostream *)pDVar8,".");
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
        std::operator<<((ostream *)pDVar8," or earlier");
        sVar9 = pDVar8->error_;
        std::__cxx11::string::_M_dispose();
      }
      else {
        if (operand_desc->numExtensions != 0 || uVar4 == 0xffffffff) {
          EnumSet<spvtools::Extension>::EnumSet
                    (&required_extensions,operand_desc->numExtensions,operand_desc->extensions);
          bVar5 = ValidationState_t::HasAnyOfExtensions(state,&required_extensions);
          sVar9 = SPV_SUCCESS;
          if (!bVar5) {
            ValidationState_t::diag(&local_208,state,SPV_ERROR_MISSING_EXTENSION,inst);
            utils::CardinalToOrdinal_abi_cxx11_(&local_228,(utils *)which_operand,cardinal_01);
            std::operator<<((ostream *)&local_208,(string *)&local_228);
            std::operator<<((ostream *)&local_208," operand of ");
            pcVar7 = spvOpcodeString((uint)(inst->inst_).opcode);
            std::operator<<((ostream *)&local_208,pcVar7);
            std::operator<<((ostream *)&local_208,": operand ");
            pDVar8 = DiagnosticStream::operator<<(&local_208,&val->name);
            std::operator<<((ostream *)pDVar8,"(");
            std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
            std::operator<<((ostream *)pDVar8,") requires one of these extensions: ");
            ExtensionSetToString_abi_cxx11_(&local_248,(spvtools *)&required_extensions,extensions);
            std::operator<<((ostream *)pDVar8,(string *)&local_248);
            sVar9 = pDVar8->error_;
            std::__cxx11::string::_M_dispose();
            std::__cxx11::string::_M_dispose();
            DiagnosticStream::~DiagnosticStream(&local_208);
          }
          std::
          _Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
          ::~_Vector_base((_Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                           *)&required_extensions);
          goto LAB_001baaec;
        }
        ValidationState_t::diag(&local_208,state,SPV_ERROR_WRONG_VERSION,inst);
        utils::CardinalToOrdinal_abi_cxx11_
                  ((string *)&required_extensions,(utils *)which_operand,cardinal_00);
        std::operator<<((ostream *)&local_208,(string *)&required_extensions);
        std::operator<<((ostream *)&local_208," operand of ");
        pcVar7 = spvOpcodeString((uint)(inst->inst_).opcode);
        std::operator<<((ostream *)&local_208,pcVar7);
        std::operator<<((ostream *)&local_208,": operand ");
        pDVar8 = DiagnosticStream::operator<<(&local_208,&val->name);
        std::operator<<((ostream *)pDVar8,"(");
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
        std::operator<<((ostream *)pDVar8,") requires SPIR-V version ");
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
        std::operator<<((ostream *)pDVar8,".");
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar8);
        std::operator<<((ostream *)pDVar8," or later");
        sVar9 = pDVar8->error_;
        std::__cxx11::string::_M_dispose();
      }
    }
    else {
      grammar = inst;
      ValidationState_t::diag(&local_208,state,SPV_ERROR_INVALID_CAPABILITY,inst);
      std::operator<<((ostream *)&local_208,"Operand ");
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::operator<<((ostream *)&local_208," of ");
      pcVar7 = spvOpcodeString((uint)(inst->inst_).opcode);
      std::operator<<((ostream *)&local_208,pcVar7);
      std::operator<<((ostream *)&local_208," requires one of these capabilities: ");
      (anonymous_namespace)::ToString_abi_cxx11_
                ((string *)&required_extensions,(_anonymous_namespace_ *)&enabling_capabilities,
                 (CapabilitySet *)this,(AssemblyGrammar *)grammar);
      std::operator<<((ostream *)&local_208,(string *)&required_extensions);
      std::__cxx11::string::_M_dispose();
      sVar9 = local_208.error_;
    }
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
LAB_001baaec:
  std::
  _Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
  ::~_Vector_base((_Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   *)&enabling_capabilities);
  return sVar9;
}

Assistant:

spv_result_t CheckRequiredCapabilities(ValidationState_t& state,
                                       const Instruction* inst,
                                       size_t which_operand,
                                       const spv_parsed_operand_t& operand,
                                       uint32_t word) {
  // Mere mention of PointSize, ClipDistance, or CullDistance in a Builtin
  // decoration does not require the associated capability.  The use of such
  // a variable value should trigger the capability requirement, but that's
  // not implemented yet.  This rule is independent of target environment.
  // See https://github.com/KhronosGroup/SPIRV-Tools/issues/365
  if (operand.type == SPV_OPERAND_TYPE_BUILT_IN) {
    switch (spv::BuiltIn(word)) {
      case spv::BuiltIn::PointSize:
      case spv::BuiltIn::ClipDistance:
      case spv::BuiltIn::CullDistance:
        return SPV_SUCCESS;
      default:
        break;
    }
  } else if (operand.type == SPV_OPERAND_TYPE_FP_ROUNDING_MODE) {
    // Allow all FP rounding modes if requested
    if (state.features().free_fp_rounding_mode) {
      return SPV_SUCCESS;
    }
  } else if (operand.type == SPV_OPERAND_TYPE_GROUP_OPERATION &&
             state.features().group_ops_reduce_and_scans &&
             (word <= uint32_t(spv::GroupOperation::ExclusiveScan))) {
    // Allow certain group operations if requested.
    return SPV_SUCCESS;
  }

  CapabilitySet enabling_capabilities;
  spv_operand_desc operand_desc = nullptr;
  const auto lookup_result =
      state.grammar().lookupOperand(operand.type, word, &operand_desc);
  if (lookup_result == SPV_SUCCESS) {
    // Allow FPRoundingMode decoration if requested.
    if (operand.type == SPV_OPERAND_TYPE_DECORATION &&
        spv::Decoration(operand_desc->value) ==
            spv::Decoration::FPRoundingMode) {
      if (state.features().free_fp_rounding_mode) return SPV_SUCCESS;

      // Vulkan API requires more capabilities on rounding mode.
      if (spvIsVulkanEnv(state.context()->target_env)) {
        enabling_capabilities.insert(
            spv::Capability::StorageUniformBufferBlock16);
        enabling_capabilities.insert(spv::Capability::StorageUniform16);
        enabling_capabilities.insert(spv::Capability::StoragePushConstant16);
        enabling_capabilities.insert(spv::Capability::StorageInputOutput16);
      }
    } else {
      enabling_capabilities = state.grammar().filterCapsAgainstTargetEnv(
          operand_desc->capabilities, operand_desc->numCapabilities);
    }

    // When encountering an OpCapability instruction, the instruction pass
    // registers a capability with the module *before* checking capabilities.
    // So in the case of an OpCapability instruction, don't bother checking
    // enablement by another capability.
    if (inst->opcode() != spv::Op::OpCapability) {
      const bool enabled_by_cap =
          state.HasAnyOfCapabilities(enabling_capabilities);
      if (!enabling_capabilities.empty() && !enabled_by_cap) {
        return state.diag(SPV_ERROR_INVALID_CAPABILITY, inst)
               << "Operand " << which_operand << " of "
               << spvOpcodeString(inst->opcode())
               << " requires one of these capabilities: "
               << ToString(enabling_capabilities, state.grammar());
      }
    }
    return OperandVersionExtensionCheck(state, inst, which_operand,
                                        *operand_desc, word);
  }
  return SPV_SUCCESS;
}